

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::TestSpec::TagPattern::matches(TagPattern *this,TestCaseInfo *testCase)

{
  StringRef original_;
  bool bVar1;
  const_iterator __lhs;
  string *in_RDI;
  StringRef *in_stack_ffffffffffffffb0;
  Tag *in_stack_ffffffffffffffb8;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  in_stack_ffffffffffffffc8;
  
  std::begin<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
            ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)in_RDI);
  std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
            ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)in_RDI);
  StringRef::StringRef(in_stack_ffffffffffffffb0,in_RDI);
  original_.m_size = (size_type)in_stack_ffffffffffffffc0._M_current;
  original_.m_start = (char *)in_stack_ffffffffffffffb8;
  Tag::Tag((Tag *)&stack0xffffffffffffffc8,original_);
  std::
  find<__gnu_cxx::__normal_iterator<Catch::Tag_const*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,Catch::Tag>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __lhs = std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
                    ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                      *)in_RDI);
  return bVar1;
}

Assistant:

bool TestSpec::TagPattern::matches( TestCaseInfo const& testCase ) const {
        return std::find( begin( testCase.tags ),
                          end( testCase.tags ),
                          Tag( m_tag ) ) != end( testCase.tags );
    }